

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O2

vault * themed_level(wchar_t index)

{
  vault *pvVar1;
  int iVar2;
  
  if (index < L'\x01') {
    __assert_fail("index >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                  ,0xc6,"struct vault *themed_level(int)");
  }
  iVar2 = player->themed_level + 1;
  pvVar1 = themed_levels;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 2) {
      return pvVar1;
    }
    pvVar1 = pvVar1->next;
  } while (pvVar1 != (vault *)0x0);
  __assert_fail("level",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                ,0xcb,"struct vault *themed_level(int)");
}

Assistant:

struct vault *themed_level(int index)
{
	int which = player->themed_level;
	struct vault *level = themed_levels;
	assert(index >= 1);

	/* Iterate to the themed level */
	while (which > 1) {
		level = level->next;
		assert(level);
		which--;
	}
	return level;
}